

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_dnd_x.cxx
# Opt level: O1

int Fl::dnd(void)

{
  Display *xid;
  int iVar1;
  int iVar2;
  Fl_Window *this;
  Fl_Window *pFVar3;
  Fl_Window *window;
  char *pcVar4;
  char *pcVar5;
  Display *window_00;
  Display *window_01;
  Atom d2;
  unsigned_long d3;
  Display *pDVar6;
  int iVar7;
  bool bVar8;
  Window child;
  int dest_y;
  int dest_x;
  Window root;
  uint junk3;
  Window new_window;
  unsigned_long local_d8;
  Display *local_a0 [2];
  Display *local_90 [4];
  Display *local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  int local_48;
  int local_44;
  undefined8 local_40;
  
  this = first_window();
  pFVar3 = first_window();
  Fl_Window::cursor(pFVar3,FL_CURSOR_MOVE);
  pFVar3 = first_window();
  if (pFVar3->i == (Fl_X *)0x0) {
    local_d8 = 0;
  }
  else {
    local_d8 = pFVar3->i->xid;
  }
  fl_local_grab = grabfunc;
  XSetSelectionOwner(fl_display,fl_XdndSelection,fl_message_window);
  if (pushed_ == (Fl_Widget *)0x0) {
    window_00 = (Display *)0x0;
    pFVar3 = (Fl_Window *)0x0;
    bVar8 = false;
  }
  else {
    iVar2 = 4;
    pFVar3 = (Fl_Window *)0x0;
    window_00 = (Display *)0x0;
    do {
      local_90[0] = (Display *)0x0;
      xid = *(Display **)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
      pDVar6 = (Display *)0x0;
      iVar7 = 0;
      window = (Fl_Window *)0x0;
      do {
        window_01 = fl_display;
        XQueryPointer(fl_display,xid,(Display *)local_a0);
        if (xid == (Display *)0x0) {
          bVar8 = false;
          if (pDVar6 == (Display *)0x0) {
            window_01 = (Display *)local_a0;
            iVar7 = dnd_aware((Window *)local_a0);
            if (iVar7 == 0) {
              iVar7 = 0;
              bVar8 = false;
            }
            else {
              local_90[0] = local_a0[0];
              pDVar6 = local_a0[0];
              bVar8 = false;
            }
          }
        }
        else {
          window_01 = xid;
          local_90[0] = xid;
          window = fl_find((Window)xid);
          pDVar6 = xid;
          if (window == (Fl_Window *)0x0) {
            window_01 = (Display *)local_90;
            iVar7 = dnd_aware((Window *)window_01);
            window = (Fl_Window *)0x0;
            bVar8 = iVar7 == 0;
          }
          else {
            bVar8 = false;
          }
        }
      } while (bVar8);
      if (local_90[0] != window_00) {
        if (pFVar3 == (Fl_Window *)0x0) {
          if (iVar2 != 0) {
            fl_sendClientMessage((Window)window_00,fl_XdndLeave,local_d8,0,0,0,0);
            window_01 = window_00;
          }
        }
        else {
          fl_local_grab = (_func_int_int *)0x0;
          e_x = e_x_root - (pFVar3->super_Fl_Group).super_Fl_Widget.x_;
          e_y = e_y_root - (pFVar3->super_Fl_Group).super_Fl_Widget.y_;
          window_01 = (Display *)0x16;
          handle(0x16,pFVar3);
          fl_local_grab = grabfunc;
        }
        window_00 = local_90[0];
        pcVar5 = fl_selection_buffer[0];
        iVar2 = iVar7;
        if (window == (Fl_Window *)0x0) {
          if (iVar7 == 0) {
            pFVar3 = (Fl_Window *)0x0;
            iVar2 = 0;
          }
          else {
            iVar1 = strncmp(fl_selection_buffer[0],"file:///",8);
            if (((((((iVar1 == 0) || (iVar1 = strncmp(pcVar5,"ftp://",6), iVar1 == 0)) ||
                   (iVar1 = strncmp(pcVar5,"http://",7), iVar1 == 0)) ||
                  ((iVar1 = strncmp(pcVar5,"https://",8), iVar1 == 0 ||
                   (iVar1 = strncmp(pcVar5,"ipp://",6), iVar1 == 0)))) ||
                 ((iVar1 = strncmp(pcVar5,"ldap:",5), iVar1 == 0 ||
                  ((iVar1 = strncmp(pcVar5,"mailto:",7), iVar1 == 0 ||
                   (iVar1 = strncmp(pcVar5,"news:",5), iVar1 == 0)))))) ||
                (iVar1 = strncmp(pcVar5,"smb://",6), iVar1 == 0)) &&
               ((pcVar4 = strchr(pcVar5,0x20), pcVar4 == (char *)0x0 &&
                (pcVar5 = strstr(pcVar5,"\r\n"), pcVar5 != (char *)0x0)))) {
              d3 = 0x1f;
              d2 = fl_XdndURIList;
            }
            else {
              d3 = 0;
              d2 = fl_XaUtf8String;
            }
            window_01 = window_00;
            fl_sendClientMessage
                      ((Window)window_00,fl_XdndEnter,local_d8,(long)(iVar7 << 0x18),d2,d3,0);
            pFVar3 = (Fl_Window *)0x0;
          }
        }
        else {
          fl_local_grab = (_func_int_int *)0x0;
          e_x = e_x_root - (window->super_Fl_Group).super_Fl_Widget.x_;
          e_y = e_y_root - (window->super_Fl_Group).super_Fl_Widget.y_;
          window_01 = (Display *)&DAT_00000014;
          handle(0x14,window);
          fl_local_grab = grabfunc;
          pFVar3 = window;
        }
      }
      if (pFVar3 == (Fl_Window *)0x0) {
        if (iVar2 != 0) {
          window_01 = window_00;
          fl_sendClientMessage
                    ((Window)window_00,fl_XdndPosition,local_d8,0,
                     (long)(e_x_root << 0x10 | e_y_root),fl_event_time,fl_XdndActionCopy);
        }
      }
      else {
        fl_local_grab = (_func_int_int *)0x0;
        e_x = e_x_root - (pFVar3->super_Fl_Group).super_Fl_Widget.x_;
        e_y = e_y_root - (pFVar3->super_Fl_Group).super_Fl_Widget.y_;
        window_01 = (Display *)&DAT_00000015;
        handle(0x15,pFVar3);
        fl_local_grab = grabfunc;
      }
      wait(window_01);
    } while (pushed_ != (Fl_Widget *)0x0);
    bVar8 = iVar2 == 0;
  }
  if (pFVar3 == (Fl_Window *)0x0) {
    if (bVar8) {
      if (window_00 != (Display *)0x0) {
        local_90[0]._0_4_ = 4;
        local_68 = *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
        local_60 = 0;
        local_58 = fl_event_time + 1;
        local_48 = e_x_root;
        local_44 = e_y_root;
        local_40 = 0x200000000;
        local_70 = window_00;
        XSendEvent(fl_display,window_00,0,0,local_90);
        local_58 = local_58 + 1;
        local_40 = CONCAT44(local_40._4_4_,0x200);
        local_90[0] = (Display *)CONCAT44(local_90[0]._4_4_,5);
        XSendEvent(fl_display,window_00,0,0,local_90);
      }
    }
    else {
      fl_sendClientMessage((Window)window_00,fl_XdndDrop,local_d8,0,fl_event_time,0,0);
    }
  }
  else {
    fl_i_own_selection[0] = '\x01';
    fl_local_grab = (_func_int_int *)0x0;
    e_x = e_x_root - (pFVar3->super_Fl_Group).super_Fl_Widget.x_;
    e_y = e_y_root - (pFVar3->super_Fl_Group).super_Fl_Widget.y_;
    iVar2 = handle(0x17,pFVar3);
    fl_local_grab = grabfunc;
    if (iVar2 != 0) {
      paste(belowmouse_,0);
    }
  }
  fl_local_grab = (_func_int_int *)0x0;
  Fl_Window::cursor(this,FL_CURSOR_DEFAULT);
  return 1;
}

Assistant:

int Fl::dnd() {
  Fl_Window *source_fl_win = Fl::first_window();
  Fl::first_window()->cursor(FL_CURSOR_MOVE);
  Window source_window = fl_xid(Fl::first_window());
  fl_local_grab = grabfunc;
  Window target_window = 0;
  Fl_Window* local_window = 0;
  int dndversion = 4; int dest_x, dest_y;
  XSetSelectionOwner(fl_display, fl_XdndSelection, fl_message_window, fl_event_time);

  while (Fl::pushed()) {

    // figure out what window we are pointing at:
    Window new_window = 0; int new_version = 0;
    Fl_Window* new_local_window = 0;
    for (Window child = RootWindow(fl_display, fl_screen);;) {
      Window root; unsigned int junk3;
      XQueryPointer(fl_display, child, &root, &child,
		    &e_x_root, &e_y_root, &dest_x, &dest_y, &junk3);
      if (!child) {
	if (!new_window && (new_version = dnd_aware(root))) new_window = root;
	break;
      }
      new_window = child;
      if ((new_local_window = fl_find(child))) break;
      if ((new_version = dnd_aware(new_window))) break;
    }

    if (new_window != target_window) {
      if (local_window) {
	local_handle(FL_DND_LEAVE, local_window);
      } else if (dndversion) {
	fl_sendClientMessage(target_window, fl_XdndLeave, source_window);
      }
      dndversion = new_version;
      target_window = new_window;
      local_window = new_local_window;
      if (local_window) {
	local_handle(FL_DND_ENTER, local_window);
      } else if (dndversion) {
        // Send an X-DND message to the target window.  In order to
	// support dragging of files/URLs as well as arbitrary text,
	// we look at the selection buffer - if the buffer starts
	// with a common URI scheme, does not contain spaces, and
	// contains at least one CR LF, then we flag the data as
	// both a URI list (MIME media type "text/uri-list") and
	// plain text.  Otherwise, we just say it is plain text.
        if ((!strncmp(fl_selection_buffer[0], "file:///", 8) ||
	     !strncmp(fl_selection_buffer[0], "ftp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "http://", 7) ||
	     !strncmp(fl_selection_buffer[0], "https://", 8) ||
	     !strncmp(fl_selection_buffer[0], "ipp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "ldap:", 5) ||
	     !strncmp(fl_selection_buffer[0], "mailto:", 7) ||
	     !strncmp(fl_selection_buffer[0], "news:", 5) ||
	     !strncmp(fl_selection_buffer[0], "smb://", 6)) &&
	    !strchr(fl_selection_buffer[0], ' ') &&
	    strstr(fl_selection_buffer[0], "\r\n")) {
	  // Send file/URI list...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XdndURIList, XA_STRING, 0);
        } else {
	  // Send plain text...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XaUtf8String, 0, 0);
	}
      }
    }
    if (local_window) {
      local_handle(FL_DND_DRAG, local_window);
    } else if (dndversion) {
      fl_sendClientMessage(target_window, fl_XdndPosition, source_window,
			   0, (e_x_root<<16)|e_y_root, fl_event_time,
			   fl_XdndActionCopy);
    }
    Fl::wait();
  }

  if (local_window) {
    fl_i_own_selection[0] = 1;
    if (local_handle(FL_DND_RELEASE, local_window)) paste(*belowmouse(), 0);
  } else if (dndversion) {
    fl_sendClientMessage(target_window, fl_XdndDrop, source_window,
			 0, fl_event_time);
  } else if (target_window) {
    // fake a drop by clicking the middle mouse button:
    XButtonEvent msg;
    msg.type = ButtonPress;
    msg.window = target_window;
    msg.root = RootWindow(fl_display, fl_screen);
    msg.subwindow = 0;
    msg.time = fl_event_time+1;
    msg.x = dest_x;
    msg.y = dest_y;
    msg.x_root = Fl::e_x_root;
    msg.y_root = Fl::e_y_root;
    msg.state = 0x0;
    msg.button = Button2;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
    msg.time++;
    msg.state = 0x200;
    msg.type = ButtonRelease;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
  }

  fl_local_grab = 0;
  source_fl_win->cursor(FL_CURSOR_DEFAULT);
  return 1;
}